

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STTx.cpp
# Opt level: O2

Value __thiscall jbcoin::STTx::getJson(STTx *this,int options,bool binary)

{
  SField **ppSVar1;
  Value *pVVar2;
  int in_ECX;
  Blob *vucData;
  base_uint<256UL,_void> *a;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  STObject *this_00;
  Value VVar4;
  Serializer s;
  string local_80;
  Value local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  ValueHolder local_38;
  SField *pSStack_30;
  pointer local_28;
  pointer pSStack_20;
  undefined8 uVar3;
  
  this_00 = (STObject *)CONCAT44(in_register_00000034,options);
  if (in_ECX == 0) {
    VVar4 = getJson(this,options);
    uVar3 = VVar4._8_8_;
  }
  else {
    ppSVar1 = &(this->super_STObject).super_STBase.fName;
    *(ushort *)ppSVar1 = *(ushort *)ppSVar1 & 0xfe00;
    STObject::getSerializer((Serializer *)&local_50,this_00);
    strHex_abi_cxx11_(&local_80,(jbcoin *)&local_50,vucData);
    Json::Value::Value((Value *)&local_38,&local_80);
    pVVar2 = Json::Value::operator[]((Value *)this,(StaticString *)&jss::tx);
    Json::Value::swap(pVVar2,(Value *)&local_38);
    Json::Value::~Value((Value *)&local_38);
    std::__cxx11::string::~string((string *)&local_80);
    local_38 = *(ValueHolder *)(this_00 + 1);
    pSStack_30 = this_00[1].super_STBase.fName;
    local_28 = this_00[1].v_.
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start;
    pSStack_20 = this_00[1].v_.
                 super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    to_string<256ul,void>(&local_80,(jbcoin *)&local_38.bool_,a);
    Json::Value::Value(&local_60,&local_80);
    pVVar2 = Json::Value::operator[]((Value *)this,(StaticString *)&jss::hash);
    Json::Value::swap(pVVar2,&local_60);
    Json::Value::~Value(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
    uVar3 = extraout_RDX;
  }
  VVar4._8_8_ = uVar3;
  VVar4.value_.map_ = (ObjectValues *)this;
  return VVar4;
}

Assistant:

Json::Value STTx::getJson (int options, bool binary) const
{
    if (binary)
    {
        Json::Value ret;
        Serializer s = STObject::getSerializer ();
        ret[jss::tx] = strHex (s.peekData ());
        ret[jss::hash] = to_string (getTransactionID ());
        return ret;
    }
    return getJson(options);
}